

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O2

void __thiscall Minisat::Solver::varBumpActivity(Solver *this,Var v,double inc)

{
  double dVar1;
  bool bVar2;
  double *pdVar3;
  int i;
  int k;
  
  pdVar3 = IntMap<int,_double,_Minisat::MkIndexDefault<int>_>::operator[]
                     (&(this->activity).super_IntMap<int,_double,_Minisat::MkIndexDefault<int>_>,v);
  dVar1 = *pdVar3;
  *pdVar3 = inc + dVar1;
  if (1e+100 < inc + dVar1) {
    for (k = 0; k < this->next_var; k = k + 1) {
      pdVar3 = IntMap<int,_double,_Minisat::MkIndexDefault<int>_>::operator[]
                         (&(this->activity).super_IntMap<int,_double,_Minisat::MkIndexDefault<int>_>
                          ,k);
      *pdVar3 = *pdVar3 * 1e-100;
    }
    this->var_inc = this->var_inc * 1e-100;
  }
  bVar2 = Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::inHeap
                    (&this->order_heap,v);
  if (bVar2) {
    Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::decrease
              (&this->order_heap,v);
    return;
  }
  return;
}

Assistant:

inline void Solver::varBumpActivity(Var v, double inc) {
    if ( (activity[v] += inc) > 1e100 ) {
        // Rescale:
        for (int i = 0; i < nVars(); i++)
            activity[i] *= 1e-100;
        var_inc *= 1e-100; }

    // Update order_heap with respect to new activity:
    if (order_heap.inHeap(v))
        order_heap.decrease(v); }